

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3WalFindFrame(Wal *pWal,Pgno pgno,u32 *piRead)

{
  u32 *puVar1;
  int iVar2;
  ushort *puVar3;
  uint uVar4;
  u32 *unaff_RBX;
  int iPage;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  int local_68;
  int local_64;
  u32 *local_60;
  Wal *local_58;
  ulong local_50;
  ulong local_48;
  uint *local_40;
  u32 *local_38;
  
  uVar7 = (pWal->hdr).mxFrame;
  local_50 = (ulong)uVar7;
  uVar6 = 0;
  local_40 = piRead;
  if (((uVar7 != 0) && (pWal->readLock != 0)) &&
     (uVar5 = (ulong)(uVar7 + 0x1000) + 0xffffffff021 >> 0xc, -1 < (int)uVar5)) {
    local_48 = (ulong)(pgno * 0x17f & 0x1fff);
    local_58 = pWal;
    do {
      iPage = (int)uVar5;
      iVar2 = walIndexPage(local_58,iPage,&local_60);
      puVar1 = local_60;
      if (iVar2 == 0) {
        if (iPage == 0) {
          local_60 = local_60 + 0x22;
          local_64 = 0;
        }
        else {
          local_64 = iPage * 0x1000 + -0x22;
        }
        unaff_RBX = puVar1 + 0x1000;
        local_38 = local_60 + -1;
      }
      uVar6 = 0;
      if (iVar2 == 0) {
        if (*(short *)((long)unaff_RBX + local_48 * 2) == 0) {
          bVar8 = true;
        }
        else {
          puVar3 = (ushort *)((long)unaff_RBX + local_48 * 2);
          uVar6 = 0;
          iVar2 = 0x2001;
          uVar5 = local_48;
          uVar7 = uVar6;
          do {
            uVar4 = (uint)*puVar3 + local_64;
            if ((uVar4 <= (uint)local_50) && (uVar6 = uVar7, local_38[*puVar3] == pgno)) {
              uVar6 = uVar4;
              uVar7 = uVar4;
            }
            bVar8 = iVar2 != 1;
            if (!bVar8) {
              local_68 = 0xb;
              sqlite3_log(0xb,"database corruption at line %d of [%.10s]",0xbaf7,
                          "118a3b35693b134d56ebd780123b7fd6f1497668");
            }
            iVar2 = iVar2 + -1;
            if (iVar2 == 0) break;
            uVar5 = (ulong)((int)uVar5 + 1U & 0x1fff);
            puVar3 = (ushort *)((long)unaff_RBX + uVar5 * 2);
          } while (*puVar3 != 0);
        }
      }
      else {
        bVar8 = false;
        uVar6 = 0;
        local_68 = iVar2;
      }
      if (!bVar8) {
        return local_68;
      }
    } while ((0 < iPage) && (uVar5 = (ulong)(iPage - 1), uVar6 == 0));
  }
  *local_40 = uVar6;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalFindFrame(
  Wal *pWal,                      /* WAL handle */
  Pgno pgno,                      /* Database page number to read data for */
  u32 *piRead                     /* OUT: Frame number (or zero) */
){
  u32 iRead = 0;                  /* If !=0, WAL frame to return data from */
  u32 iLast = pWal->hdr.mxFrame;  /* Last page in WAL for this reader */
  int iHash;                      /* Used to loop through N hash tables */

  /* This routine is only be called from within a read transaction. */
  assert( pWal->readLock>=0 || pWal->lockError );

  /* If the "last page" field of the wal-index header snapshot is 0, then
  ** no data will be read from the wal under any circumstances. Return early
  ** in this case as an optimization.  Likewise, if pWal->readLock==0, 
  ** then the WAL is ignored by the reader so return early, as if the 
  ** WAL were empty.
  */
  if( iLast==0 || pWal->readLock==0 ){
    *piRead = 0;
    return SQLITE_OK;
  }

  /* Search the hash table or tables for an entry matching page number
  ** pgno. Each iteration of the following for() loop searches one
  ** hash table (each hash table indexes up to HASHTABLE_NPAGE frames).
  **
  ** This code might run concurrently to the code in walIndexAppend()
  ** that adds entries to the wal-index (and possibly to this hash 
  ** table). This means the value just read from the hash 
  ** slot (aHash[iKey]) may have been added before or after the 
  ** current read transaction was opened. Values added after the
  ** read transaction was opened may have been written incorrectly -
  ** i.e. these slots may contain garbage data. However, we assume
  ** that any slots written before the current read transaction was
  ** opened remain unmodified.
  **
  ** For the reasons above, the if(...) condition featured in the inner
  ** loop of the following block is more stringent that would be required 
  ** if we had exclusive access to the hash-table:
  **
  **   (aPgno[iFrame]==pgno): 
  **     This condition filters out normal hash-table collisions.
  **
  **   (iFrame<=iLast): 
  **     This condition filters out entries that were added to the hash
  **     table after the current read-transaction had started.
  */
  for(iHash=walFramePage(iLast); iHash>=0 && iRead==0; iHash--){
    volatile ht_slot *aHash;      /* Pointer to hash table */
    volatile u32 *aPgno;          /* Pointer to array of page numbers */
    u32 iZero;                    /* Frame number corresponding to aPgno[0] */
    int iKey;                     /* Hash slot index */
    int nCollide;                 /* Number of hash collisions remaining */
    int rc;                       /* Error code */

    rc = walHashGet(pWal, iHash, &aHash, &aPgno, &iZero);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    nCollide = HASHTABLE_NSLOT;
    for(iKey=walHash(pgno); aHash[iKey]; iKey=walNextHash(iKey)){
      u32 iFrame = aHash[iKey] + iZero;
      if( iFrame<=iLast && aPgno[aHash[iKey]]==pgno ){
        /* assert( iFrame>iRead ); -- not true if there is corruption */
        iRead = iFrame;
      }
      if( (nCollide--)==0 ){
        return SQLITE_CORRUPT_BKPT;
      }
    }
  }

#ifdef SQLITE_ENABLE_EXPENSIVE_ASSERT
  /* If expensive assert() statements are available, do a linear search
  ** of the wal-index file content. Make sure the results agree with the
  ** result obtained using the hash indexes above.  */
  {
    u32 iRead2 = 0;
    u32 iTest;
    for(iTest=iLast; iTest>0; iTest--){
      if( walFramePgno(pWal, iTest)==pgno ){
        iRead2 = iTest;
        break;
      }
    }
    assert( iRead==iRead2 );
  }
#endif

  *piRead = iRead;
  return SQLITE_OK;
}